

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result,
          FlatAllocator *alloc)

{
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  RepeatedPtrFieldBase *this_01;
  void **ppvVar1;
  size_type *psVar2;
  PointerT<char> pcVar3;
  ushort *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  long lVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  size_type sVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 *puVar10;
  DescriptorNames DVar11;
  pointer prVar12;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_00;
  FieldDescriptor *pFVar14;
  EnumDescriptor *pEVar15;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_01;
  ExtensionRange *pEVar16;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar17;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar18;
  Descriptor *pDVar19;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar20;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  string *psVar21;
  anon_union_8_1_a8a14541_for_iterator_2 aVar22;
  DescriptorPool *pDVar23;
  Rep *pRVar24;
  Nonnull<const_char_*> pcVar25;
  undefined8 extraout_RAX;
  int iVar26;
  uint uVar27;
  char *pcVar28;
  uint uVar29;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar30;
  undefined8 uVar31;
  iterator *b;
  InternalMetadata IVar32;
  ulong uVar33;
  long lVar34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *a;
  long lVar35;
  long lVar36;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  ulong uVar37;
  string_view scope;
  string_view name;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view element_name_06;
  iterator iVar38;
  string_view proto_name;
  string_view full_name_00;
  string_view option_name;
  string_view name_00;
  FieldDescriptor *field;
  ExtensionRange *range;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  iterator it;
  Symbol local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
  *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [80];
  code *pcStack_98;
  undefined8 local_90;
  code *pcStack_88;
  undefined8 local_80;
  code *pcStack_78;
  pointer local_70;
  code *pcStack_68;
  pointer local_60;
  code *pcStack_58;
  VoidPtr local_50;
  code *pcStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (parent == (Descriptor *)0x0) {
    psVar21 = this->file_->package_;
    pcVar28 = (psVar21->_M_dataplus)._M_p;
    uVar33 = psVar21->_M_string_length;
  }
  else {
    pcVar28 = (parent->all_names_).payload_;
    uVar33 = (ulong)*(ushort *)(pcVar28 + 2);
    pcVar28 = pcVar28 + ~uVar33;
  }
  puVar10 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = pcVar28;
  scope._M_len = uVar33;
  proto_name._M_str = (char *)*puVar10;
  proto_name._M_len = puVar10[1];
  local_138.ptr_ = &result->super_SymbolBase;
  DVar11 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  ((DescriptorNames *)(local_138.ptr_ + 0x10))->payload_ = DVar11.payload_;
  puVar10 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar11.payload_ + 2);
  full_name_00._M_str = (FlatAllocator *)(DVar11.payload_ + ~full_name_00._M_len);
  name._M_str = (char *)*puVar10;
  name._M_len = puVar10[1];
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  *(FileDescriptor **)(local_138.ptr_ + 0x18) = this->file_;
  *(Descriptor **)(local_138.ptr_ + 0x20) = parent;
  local_138.ptr_[1].symbol_type_ = local_138.ptr_[1].symbol_type_ & 0xfe;
  *(ushort *)(local_138.ptr_ + 1) = *(ushort *)(local_138.ptr_ + 1) & 0xfffd;
  *(ushort *)(local_138.ptr_ + 1) = *(ushort *)(local_138.ptr_ + 1) & 0xff83;
  *(MessageOptions **)(local_138.ptr_ + 0x28) = (MessageOptions *)0x0;
  *(ushort *)(local_138.ptr_ + 1) =
       *(ushort *)(local_138.ptr_ + 1) & 0xfcff |
       (ushort)(((proto->field_0)._impl_.visibility_ & 3U) << 8);
  local_e8._0_8_ = ZEXT28(*(ushort *)(((DescriptorNames *)(local_138.ptr_ + 0x10))->payload_ + 2));
  local_e8._8_8_ = ((DescriptorNames *)(local_138.ptr_ + 0x10))->payload_ + ~local_e8._0_8_;
  local_130.field_2._8_8_ = parent;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                           *)&((this->pool_->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                              ._M_head_impl)->well_known_types_,
                          (key_arg<std::basic_string_view<char>_> *)local_e8);
  a = &local_40;
  local_130._M_string_length = (size_type)this;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              *)&((this->pool_->tables_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                 _M_head_impl)->well_known_types_);
  local_e8._0_8_ = (DescriptorPool *)0x0;
  b = (iterator *)local_e8;
  bVar8 = absl::lts_20250127::container_internal::operator==((iterator *)a,b);
  if (!bVar8) {
    prVar12 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              ::iterator::operator->((iterator *)&local_40);
    *(ushort *)(local_138.ptr_ + 1) =
         (*(ushort *)(local_138.ptr_ + 1) & 0xff83) + ((ushort)prVar12->second & 0x1f) * 4;
  }
  *(uint16_t *)(local_138.ptr_ + 4) = 0;
  this_00 = &(proto->field_0)._impl_.field_;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    uVar27 = 0;
    do {
      b = (iterator *)(ulong)uVar27;
      pVVar13 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&this_00->super_RepeatedPtrFieldBase,uVar27);
      uVar29 = uVar27 + 1;
      if (((pVVar13->field_0)._impl_.number_ != uVar29) ||
         (*(uint16_t *)(local_138.ptr_ + 4) = (uint16_t)uVar29, 0xfffd < uVar27)) break;
      uVar27 = uVar29;
    } while ((int)uVar29 < *(int *)((long)&proto->field_0 + 0x10));
  }
  iVar26 = *(int *)((long)&proto->field_0 + 0x88);
  *(int *)(local_138.ptr_ + 0x80) = iVar26;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    BuildMessage((DescriptorBuilder *)local_e8);
    iVar9 = extraout_EAX;
LAB_0021bf87:
    pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar9,(long)b,"used <= total_.template Get<TypeToUse>()");
  }
  else {
    iVar9 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<char>.value;
    a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(long)iVar9;
    iVar9 = iVar26 * 0x38 + iVar9;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar9;
    iVar26 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).total_.payload_.super_Base<char>.value;
    b = (iterator *)(long)iVar26;
    local_e8._32_8_ = this_00;
    if (iVar26 < iVar9) goto LAB_0021bf87;
    pcVar25 = (Nonnull<const_char_*>)0x0;
  }
  sVar6 = local_130._M_string_length;
  if (pcVar25 != (Nonnull<const_char_*>)0x0) {
    BuildMessage();
    goto LAB_0021bfc6;
  }
  *(OneofDescriptor **)(local_138.ptr_ + 0x48) = (OneofDescriptor *)(a->_M_local_buf + (long)pcVar3)
  ;
  if (0 < *(int *)((long)&proto->field_0 + 0x88)) {
    a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0;
    lVar35 = 0;
    do {
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                           (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                            (int)lVar35);
      full_name_00._M_str = alloc;
      BuildOneof((DescriptorBuilder *)sVar6,proto_00,(Descriptor *)local_138.ptr_,
                 (OneofDescriptor *)
                 (&(*(OneofDescriptor **)(local_138.ptr_ + 0x48))->super_SymbolBase + (long)a),alloc
                );
      lVar35 = lVar35 + 1;
      a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)a + 0x38);
    } while (lVar35 < *(int *)((long)&proto->field_0 + 0x88));
  }
  iVar26 = *(int *)((long)&proto->field_0 + 0x10);
  *(int *)(local_138.ptr_ + 8) = iVar26;
  pFVar14 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar26);
  uVar31 = local_e8._32_8_;
  *(FieldDescriptor **)(local_138.ptr_ + 0x40) = pFVar14;
  if (0 < *(int *)((long)&proto->field_0 + 0x10)) {
    a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0;
    lVar35 = 0;
    do {
      pVVar13 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          ((RepeatedPtrFieldBase *)uVar31,(int)lVar35);
      full_name_00._M_str = (FlatAllocator *)0x0;
      BuildFieldOrExtension
                ((DescriptorBuilder *)sVar6,pVVar13,(Descriptor *)local_138.ptr_,
                 (FieldDescriptor *)
                 (&(*(FieldDescriptor **)(local_138.ptr_ + 0x40))->super_SymbolBase + (long)a),false
                 ,alloc);
      lVar35 = lVar35 + 1;
      a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)a + 0x58);
    } while (lVar35 < *(int *)((long)&proto->field_0 + 0x10));
  }
  iVar26 = *(int *)((long)&proto->field_0 + 0x40);
  *(int *)(local_138.ptr_ + 0x8c) = iVar26;
  pEVar15 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::EnumDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar26);
  *(EnumDescriptor **)(local_138.ptr_ + 0x58) = pEVar15;
  if (0 < *(int *)((long)&proto->field_0 + 0x40)) {
    a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0;
    lVar35 = 0;
    do {
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            (int)lVar35);
      full_name_00._M_str = alloc;
      BuildEnum((DescriptorBuilder *)sVar6,proto_01,(Descriptor *)local_138.ptr_,
                (EnumDescriptor *)
                (&(*(EnumDescriptor **)(local_138.ptr_ + 0x58))->super_SymbolBase + (long)a),alloc);
      lVar35 = lVar35 + 1;
      a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)a + 0x58);
    } while (lVar35 < *(int *)((long)&proto->field_0 + 0x40));
  }
  iVar26 = *(int *)((long)&proto->field_0 + 0x58);
  *(int *)(local_138.ptr_ + 0x90) = iVar26;
  pEVar16 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::Descriptor::ExtensionRange>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,iVar26);
  *(ExtensionRange **)(local_138.ptr_ + 0x60) = pEVar16;
  if (0 < *(int *)((long)&proto->field_0 + 0x58)) {
    a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0;
    lVar35 = 0;
    do {
      pVVar17 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                          (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                           (int)lVar35);
      full_name_00._M_str = alloc;
      BuildExtensionRange((DescriptorBuilder *)sVar6,pVVar17,(Descriptor *)local_138.ptr_,
                          (ExtensionRange *)
                          ((long)a + (long)&(*(ExtensionRange **)(local_138.ptr_ + 0x60))->start_),
                          alloc);
      lVar35 = lVar35 + 1;
      a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)a + 0x28);
    } while (lVar35 < *(int *)((long)&proto->field_0 + 0x58));
  }
  uVar27 = *(uint *)((long)&proto->field_0 + 0x70);
  pVVar13 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
             *)(ulong)uVar27;
  *(uint *)(local_138.ptr_ + 0x94) = uVar27;
  pFVar14 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateArray<google::protobuf::FieldDescriptor>
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,uVar27);
  *(FieldDescriptor **)(local_138.ptr_ + 0x68) = pFVar14;
  if (0 < *(int *)((long)&proto->field_0 + 0x70)) {
    a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0;
    lVar35 = 0;
    do {
      pVVar13 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                           (int)lVar35);
      full_name_00._M_str = (FlatAllocator *)0x1;
      BuildFieldOrExtension
                ((DescriptorBuilder *)sVar6,pVVar13,(Descriptor *)local_138.ptr_,
                 (FieldDescriptor *)
                 (&(*(FieldDescriptor **)(local_138.ptr_ + 0x68))->super_SymbolBase + (long)a),true,
                 alloc);
      lVar35 = lVar35 + 1;
      a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)a + 0x58);
    } while (lVar35 < *(int *)((long)&proto->field_0 + 0x70));
  }
  iVar26 = *(int *)((long)&proto->field_0 + 0xa0);
  *(int *)(local_138.ptr_ + 0x98) = iVar26;
  pcVar3 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar3 == (PointerT<char>)0x0) {
    BuildMessage((DescriptorBuilder *)local_e8);
    iVar9 = extraout_EAX_00;
LAB_0021bfa5:
    pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((long)iVar9,(long)pVVar13,"used <= total_.template Get<TypeToUse>()");
  }
  else {
    iVar9 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<char>.value;
    a = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(long)iVar9;
    iVar9 = iVar9 + iVar26 * 8;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar9;
    iVar26 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).total_.payload_.super_Base<char>.value;
    pVVar13 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
               *)(long)iVar26;
    if (iVar26 < iVar9) goto LAB_0021bfa5;
    pcVar25 = (Nonnull<const_char_*>)0x0;
  }
  sVar6 = local_130._M_string_length;
  if (pcVar25 == (Nonnull<const_char_*>)0x0) {
    *(ReservedRange **)(local_138.ptr_ + 0x70) = (ReservedRange *)(a->_M_local_buf + (long)pcVar3);
    if (0 < *(int *)((long)&proto->field_0 + 0xa0)) {
      lVar35 = 0;
      lVar36 = 0;
      do {
        pVVar18 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                            (&(proto->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                             (int)lVar36);
        BuildReservedRange((DescriptorBuilder *)sVar6,pVVar18,(Descriptor *)local_138.ptr_,
                           (ReservedRange *)
                           ((long)&(*(ReservedRange **)(local_138.ptr_ + 0x70))->start + lVar35),
                           full_name_00._M_str);
        lVar36 = lVar36 + 1;
        lVar35 = lVar35 + 8;
      } while (lVar36 < *(int *)((long)&proto->field_0 + 0xa0));
    }
    option_name._M_str = "google.protobuf.MessageOptions";
    option_name._M_len = 0x1e;
    AllocateOptions<google::protobuf::Descriptor>
              ((DescriptorBuilder *)sVar6,proto,(Descriptor *)local_138.ptr_,7,option_name,alloc);
    iVar26 = *(int *)(sVar6 + 0x170);
    *(int *)(sVar6 + 0x170) = iVar26 + -1;
    if (iVar26 < 2) {
      element_name._M_len =
           (ulong)*(ushort *)(((DescriptorNames *)(local_138.ptr_ + 0x10))->payload_ + 2);
      element_name._M_str =
           ((DescriptorNames *)(local_138.ptr_ + 0x10))->payload_ + ~element_name._M_len;
      AddError((DescriptorBuilder *)sVar6,element_name,&proto->super_Message,OTHER,
               "Reached maximum recursion limit for nested messages.");
      *(Descriptor **)(local_138.ptr_ + 0x50) = (Descriptor *)0x0;
      *(int *)(local_138.ptr_ + 0x88) = 0;
    }
    else {
      iVar26 = *(int *)((long)&proto->field_0 + 0x28);
      *(int *)(local_138.ptr_ + 0x88) = iVar26;
      pDVar19 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::Descriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar26);
      *(Descriptor **)(local_138.ptr_ + 0x50) = pDVar19;
      if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
        lVar35 = 0;
        lVar36 = 0;
        do {
          proto_02 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                               (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                                (int)lVar36);
          BuildMessage((DescriptorBuilder *)local_130._M_string_length,proto_02,
                       (Descriptor *)local_138.ptr_,
                       (Descriptor *)
                       (&(*(Descriptor **)(local_138.ptr_ + 0x50))->super_SymbolBase + lVar35),alloc
                      );
          lVar36 = lVar36 + 1;
          lVar35 = lVar35 + 0xa0;
        } while (lVar36 < *(int *)((long)&proto->field_0 + 0x28));
      }
      uVar27 = *(uint *)((long)&proto->field_0 + 0xb8);
      *(uint *)(local_138.ptr_ + 0x9c) = uVar27;
      ppbVar20 = protobuf::(anonymous_namespace)::
                 FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                 ::AllocateArray<std::__cxx11::string_const*>
                           ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                             *)alloc,uVar27);
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)
       (local_138.ptr_ + 0x78) = ppbVar20;
      local_130.field_2._M_allocated_capacity = (size_type)proto;
      if (0 < (int)uVar27) {
        uVar33 = 0;
        do {
          in = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,
                          (int)uVar33);
          psVar21 = protobuf::(anonymous_namespace)::
                    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    ::AllocateStrings<std::__cxx11::string_const&>
                              ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                                *)alloc,in);
          (*(string ***)(local_138.ptr_ + 0x78))[uVar33] = psVar21;
          uVar33 = uVar33 + 1;
        } while (uVar27 != uVar33);
      }
      uVar31 = local_130.field_2._M_allocated_capacity;
      puVar4 = *(ushort **)(local_138.ptr_ + 0x10);
      full_name._M_len = (ulong)puVar4[1];
      full_name._M_str = (char *)(~full_name._M_len + (long)puVar4);
      name_00._M_len = (ulong)*puVar4;
      name_00._M_str = (char *)(~name_00._M_len + (long)puVar4);
      (local_138.ptr_)->symbol_type_ = '\x01';
      AddSymbol((DescriptorBuilder *)local_130._M_string_length,full_name,
                (void *)local_130.field_2._8_8_,name_00,
                (Message *)local_130.field_2._M_allocated_capacity,local_138);
      if (0 < *(int *)(uVar31 + 0xb0)) {
        this_01 = (RepeatedPtrFieldBase *)(uVar31 + 0xa8);
        uVar27 = 0;
        do {
          aVar22.slot_ = (slot_type *)
                         internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                   (this_01,uVar27);
          iVar26 = uVar27 + 1;
          local_110 = (flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                       *)CONCAT44(local_110._4_4_,iVar26);
          local_130.field_2._8_8_ = (Descriptor *)(ulong)uVar27;
          if (iVar26 < *(int *)(local_130.field_2._M_allocated_capacity + 0xb0)) {
            do {
              pDVar23 = (DescriptorPool *)
                        internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                  (this_01,iVar26);
              if ((*(int *)&pDVar23->fallback_database_ < *(int *)((long)aVar22.slot_ + 0x1c)) &&
                 (*(int *)((long)aVar22.slot_ + 0x18) <
                  *(int *)((long)&pDVar23->fallback_database_ + 4))) {
                lVar35 = *(long *)(local_138.ptr_ + 0x10);
                uVar33 = (ulong)*(ushort *)(lVar35 + 2);
                pVVar18 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    (this_01,(int)local_130.field_2._8_8_);
                pcStack_48 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                ;
                local_50.obj = local_e8;
                make_error.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
                ;
                make_error.ptr_.obj = local_50.obj;
                element_name_00._M_str = (char *)(lVar35 + ~uVar33);
                element_name_00._M_len = uVar33;
                local_e8._0_8_ = pDVar23;
                local_e8._8_8_ = aVar22.slot_;
                AddError((DescriptorBuilder *)local_130._M_string_length,element_name_00,
                         &pVVar18->super_Message,NUMBER,make_error);
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 < *(int *)(local_130.field_2._M_allocated_capacity + 0xb0));
          }
          uVar31 = local_130.field_2._M_allocated_capacity;
          uVar27 = (uint)local_110;
        } while ((int)(uint)local_110 < *(int *)(local_130.field_2._M_allocated_capacity + 0xb0));
      }
      local_e8._0_8_ = (DescriptorPool *)0x1;
      local_e8._8_8_ = (slot_type *)0x0;
      this_02 = &(((DescriptorProto *)uVar31)->field_0)._impl_.reserved_name_;
      pRVar30 = this_02;
      if ((*(byte *)((long)&((DescriptorProto *)uVar31)->field_0 + 0xb0) & 1) != 0) {
        pRVar24 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
        pRVar30 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar24->elements;
      }
      if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pRVar24 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
        this_02 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar24->elements;
      }
      ppvVar1 = &(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                *(int *)((long)&((DescriptorProto *)uVar31)->field_0 + 0xb8);
      if (pRVar30 !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)ppvVar1) {
        psVar2 = &local_108._M_string_length;
        do {
          key_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (pRVar30->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
          local_130._M_dataplus._M_p = local_e8;
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::EmplaceDecomposable::operator()
                    ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                      *)psVar2,&local_130,key_00,key_00);
          if (local_108.field_2._M_local_buf[8] == '\0') {
            pcStack_58 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
            ;
            make_error_00.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
            ;
            make_error_00.ptr_.obj = psVar2;
            element_name_01._M_str = (key_00->_M_dataplus)._M_p;
            element_name_01._M_len = key_00->_M_string_length;
            local_108._M_string_length = (size_type)key_00;
            local_60 = (pointer)psVar2;
            AddError((DescriptorBuilder *)local_130._M_string_length,element_name_01,
                     (Message *)local_130.field_2._M_allocated_capacity,NAME,make_error_00);
          }
          pRVar30 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&(pRVar30->super_RepeatedPtrFieldBase).current_size_;
        } while (pRVar30 !=
                 (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)ppvVar1);
      }
      if (0 < *(int *)(local_138.ptr_ + 8)) {
        local_110 = (flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                     *)(local_130._M_string_length + 0xe8);
        local_130.field_2._8_8_ = local_130.field_2._M_allocated_capacity + 0x60;
        local_e8._48_8_ = local_130.field_2._M_allocated_capacity + 0xa8;
        IVar32.ptr_ = 0;
        psVar2 = &local_108._M_string_length;
        do {
          local_130._M_dataplus._M_p =
               (pointer)(*(long *)(local_138.ptr_ + 0x40) + IVar32.ptr_ * 0x58);
          local_e8._40_8_ = IVar32.ptr_;
          if (0 < *(int *)(local_138.ptr_ + 0x90)) {
            lVar35 = 0;
            lVar36 = 0;
            do {
              lVar34 = *(long *)(local_138.ptr_ + 0x60);
              local_108._M_dataplus._M_p = (pointer)(lVar34 + lVar35);
              if ((*(int *)(lVar34 + lVar35) <= *(int *)(local_130._M_dataplus._M_p + 4)) &&
                 (*(int *)(local_130._M_dataplus._M_p + 4) < *(int *)(lVar34 + 4 + lVar35))) {
                absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                ::try_emplace_impl<google::protobuf::Descriptor*const&>
                          ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                            *)psVar2,local_110,(Descriptor **)&local_138);
                uVar31 = local_108.field_2._M_allocated_capacity;
                pVVar17 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    ((RepeatedPtrFieldBase *)local_130.field_2._8_8_,(int)lVar36);
                iVar26 = *(int *)(uVar31 + 8);
                if (iVar26 < 0) {
                  iVar26 = -1;
                }
                uVar27 = iVar26 + 1;
                if (0x1ffffffe < uVar27) {
                  uVar27 = 0x1fffffff;
                }
                *(uint *)(uVar31 + 8) = uVar27;
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar31 + 0x10))->_M_allocated_capacity == 0) {
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar31 + 0x10))->_M_allocated_capacity = (size_type)pVVar17;
                  *(undefined4 *)(uVar31 + 0x18) = 1;
                }
                lVar34 = *(long *)(local_130._M_dataplus._M_p + 8);
                uVar33 = (ulong)*(ushort *)(lVar34 + 2);
                pVVar17 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    ((RepeatedPtrFieldBase *)local_130.field_2._8_8_,(int)lVar36);
                local_108._M_string_length = (size_type)&local_108;
                local_108.field_2._M_allocated_capacity = (size_type)&local_130;
                pcStack_68 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                ;
                make_error_01.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
                ;
                make_error_01.ptr_.obj = psVar2;
                element_name_02._M_str = (char *)(lVar34 + ~uVar33);
                element_name_02._M_len = uVar33;
                local_70 = (pointer)psVar2;
                AddError((DescriptorBuilder *)local_130._M_string_length,element_name_02,
                         &pVVar17->super_Message,NUMBER,make_error_01);
              }
              lVar36 = lVar36 + 1;
              lVar35 = lVar35 + 0x28;
            } while (lVar36 < *(int *)(local_138.ptr_ + 0x90));
          }
          uVar31 = local_e8._48_8_;
          if (0 < *(int *)(local_138.ptr_ + 0x98)) {
            lVar35 = 0;
            do {
              if ((*(int *)(*(long *)(local_138.ptr_ + 0x70) + lVar35 * 8) <=
                   *(int *)(local_130._M_dataplus._M_p + 4)) &&
                 (*(int *)(local_130._M_dataplus._M_p + 4) <
                  *(int *)(*(long *)(local_138.ptr_ + 0x70) + lVar35 * 8 + 4))) {
                absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
                ::try_emplace_impl<google::protobuf::Descriptor*const&>
                          ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
                            *)psVar2,local_110,(Descriptor **)&local_138);
                uVar7 = local_108.field_2._M_allocated_capacity;
                pVVar18 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    ((RepeatedPtrFieldBase *)uVar31,(int)lVar35);
                iVar26 = *(int *)(uVar7 + 8);
                if (iVar26 < 0) {
                  iVar26 = -1;
                }
                uVar27 = iVar26 + 1;
                if (0x1ffffffe < uVar27) {
                  uVar27 = 0x1fffffff;
                }
                *(uint *)(uVar7 + 8) = uVar27;
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(uVar7 + 0x10))->_M_allocated_capacity == 0) {
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(uVar7 + 0x10))->_M_allocated_capacity = (size_type)pVVar18;
                  *(undefined4 *)(uVar7 + 0x18) = 1;
                }
                lVar36 = *(long *)(local_130._M_dataplus._M_p + 8);
                uVar33 = (ulong)*(ushort *)(lVar36 + 2);
                pVVar18 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                                    ((RepeatedPtrFieldBase *)uVar31,(int)lVar35);
                local_108._M_string_length = (size_type)&local_130;
                pcStack_78 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                ;
                make_error_02.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
                ;
                make_error_02.ptr_.obj = psVar2;
                element_name_03._M_str = (char *)(lVar36 + ~uVar33);
                element_name_03._M_len = uVar33;
                local_80 = psVar2;
                AddError((DescriptorBuilder *)local_130._M_string_length,element_name_03,
                         &pVVar18->super_Message,NUMBER,make_error_02);
              }
              lVar35 = lVar35 + 1;
            } while (lVar35 < *(int *)(local_138.ptr_ + 0x98));
          }
          local_108._M_string_length = (size_type)**(ushort **)(local_130._M_dataplus._M_p + 8);
          local_108.field_2._M_allocated_capacity =
               (long)*(ushort **)(local_130._M_dataplus._M_p + 8) + ~local_108._M_string_length;
          iVar38 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                               *)local_e8,(key_arg<std::basic_string_view<char>_> *)psVar2);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_e8);
          if (iVar38.ctrl_ != (ctrl_t *)0x0) {
            lVar35 = *(long *)(local_130._M_dataplus._M_p + 8);
            uVar33 = (ulong)*(ushort *)(lVar35 + 2);
            pVVar13 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                ((RepeatedPtrFieldBase *)local_e8._32_8_,(int)local_e8._40_8_);
            local_108._M_string_length = (size_type)&local_130;
            pcStack_88 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
            ;
            make_error_03.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__4,std::__cxx11::string>
            ;
            make_error_03.ptr_.obj = psVar2;
            element_name_04._M_str = (char *)(lVar35 + ~uVar33);
            element_name_04._M_len = uVar33;
            local_90 = psVar2;
            AddError((DescriptorBuilder *)local_130._M_string_length,element_name_04,
                     &pVVar13->super_Message,NAME,make_error_03);
          }
          IVar32.ptr_ = local_e8._40_8_ + 1;
        } while (IVar32.ptr_ < *(int *)(local_138.ptr_ + 8));
      }
      if (0 < *(int *)(local_138.ptr_ + 0x90)) {
        local_130.field_2._M_allocated_capacity = local_130.field_2._M_allocated_capacity + 0x60;
        local_130.field_2._8_8_ = (Descriptor *)0x28;
        local_110 = (flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                     *)CONCAT44(local_110._4_4_,1);
        lVar35 = 0;
        do {
          local_130._M_dataplus._M_p = (pointer)(*(long *)(local_138.ptr_ + 0x60) + lVar35 * 0x28);
          iVar26 = (int)lVar35;
          if (0 < *(int *)(local_138.ptr_ + 0x98)) {
            lVar34 = 0;
            lVar36 = 0;
            do {
              lVar5 = *(long *)(local_138.ptr_ + 0x70);
              local_108._M_dataplus._M_p = (pointer)(lVar5 + lVar34);
              if ((*(int *)(lVar5 + lVar34) < *(int *)(local_130._M_dataplus._M_p + 4)) &&
                 (*(int *)local_130._M_dataplus._M_p < *(int *)(lVar5 + 4 + lVar34))) {
                lVar5 = *(long *)(local_138.ptr_ + 0x10);
                uVar33 = (ulong)*(ushort *)(lVar5 + 2);
                pVVar17 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    ((RepeatedPtrFieldBase *)local_130.field_2._M_allocated_capacity
                                     ,iVar26);
                local_108._M_string_length = (size_type)&local_130;
                local_108.field_2._M_allocated_capacity = (size_type)&local_108;
                pcStack_98 = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                ;
                local_e8._72_8_ = &local_108._M_string_length;
                make_error_04.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
                ;
                make_error_04.ptr_.obj = (void *)local_e8._72_8_;
                element_name_05._M_str = (char *)(lVar5 + ~uVar33);
                element_name_05._M_len = uVar33;
                AddError((DescriptorBuilder *)local_130._M_string_length,element_name_05,
                         &pVVar17->super_Message,NUMBER,make_error_04);
              }
              lVar36 = lVar36 + 1;
              lVar34 = lVar34 + 8;
            } while (lVar36 < *(int *)(local_138.ptr_ + 0x98));
          }
          lVar35 = lVar35 + 1;
          if (lVar35 < *(int *)(local_138.ptr_ + 0x90)) {
            uVar33 = (ulong)local_110 & 0xffffffff;
            uVar31 = local_130.field_2._8_8_;
            do {
              lVar36 = *(long *)(local_138.ptr_ + 0x60);
              local_108._M_dataplus._M_p =
                   (pointer)(&((Descriptor *)uVar31)->super_SymbolBase + lVar36);
              if ((*(int *)(&((Descriptor *)uVar31)->super_SymbolBase + lVar36) <
                   *(int *)(local_130._M_dataplus._M_p + 4)) &&
                 (*(int *)local_130._M_dataplus._M_p <
                  *(int *)((long)&((Descriptor *)uVar31)->sequential_field_limit_ + lVar36))) {
                lVar36 = *(long *)(local_138.ptr_ + 0x10);
                uVar37 = (ulong)*(ushort *)(lVar36 + 2);
                pVVar17 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                                    ((RepeatedPtrFieldBase *)local_130.field_2._M_allocated_capacity
                                     ,iVar26);
                local_108._M_string_length = (size_type)&local_108;
                local_108.field_2._M_allocated_capacity = (size_type)&local_130;
                local_e8._64_8_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                ;
                local_e8._56_8_ = &local_108._M_string_length;
                make_error_05.invoker_ =
                     absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__6,std::__cxx11::string>
                ;
                make_error_05.ptr_.obj = (void *)local_e8._56_8_;
                element_name_06._M_str = (char *)(lVar36 + ~uVar37);
                element_name_06._M_len = uVar37;
                AddError((DescriptorBuilder *)local_130._M_string_length,element_name_06,
                         &pVVar17->super_Message,NUMBER,make_error_05);
              }
              uVar31 = &((Descriptor *)uVar31)->options_;
              uVar27 = (int)uVar33 + 1;
              uVar33 = (ulong)uVar27;
            } while ((int)uVar27 < *(int *)(local_138.ptr_ + 0x90));
          }
          local_130.field_2._8_8_ = local_130.field_2._8_8_ + 0x28;
          local_110 = (flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                       *)CONCAT44(local_110._4_4_,(uint)local_110 + 1);
        } while (lVar35 < *(int *)(local_138.ptr_ + 0x90));
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)local_e8);
    }
    *(int *)(local_130._M_string_length + 0x170) = *(int *)(local_130._M_string_length + 0x170) + 1;
    return;
  }
LAB_0021bfc6:
  BuildMessage();
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_e8);
  *(int *)(local_130._M_string_length + 0x170) = *(int *)(local_130._M_string_length + 0x170) + 1;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result,
                                     internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->well_known_type_ = Descriptor::WELLKNOWNTYPE_UNSPECIFIED;
  result->options_ = nullptr;  // Set to default_instance later if necessary.
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  auto it = pool_->tables_->well_known_types_.find(result->full_name());
  if (it != pool_->tables_->well_known_types_.end()) {
    result->well_known_type_ = it->second;
  }

  // Calculate the continuous sequence of fields.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_field_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // messages, but it is unlikely.
  result->sequential_field_limit_ = 0;
  for (int i = 0; i < std::numeric_limits<uint16_t>::max() &&
                  i < proto.field_size() && proto.field(i).number() == i + 1;
       ++i) {
    result->sequential_field_limit_ = i + 1;
  }

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl, BuildOneof, result);
  BUILD_ARRAY(proto, result, field, BuildField, result);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension, BuildExtension, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy options.
  AllocateOptions(proto, result, DescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MessageOptions", alloc);

  // Before building submessages, check recursion limit.
  --recursion_depth_;
  IncrementWhenDestroyed revert{recursion_depth_};
  if (recursion_depth_ <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Reached maximum recursion limit for nested messages.");
    result->nested_types_ = nullptr;
    result->nested_type_count_ = 0;
    return;
  }
  BUILD_ARRAY(proto, result, nested_type, BuildMessage, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end() - 1, range1.start(),
                       range1.end() - 1);
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Field name \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }
  // Check that fields aren't using reserved names or numbers and that they
  // aren't using extension numbers.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start_number() <= field->number() &&
          field->number() < range->end_number()) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.extension_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 includes field \"$2\" ($3).",
                       range->start_number(), range->end_number() - 1,
                       field->name(), field->number());
                 });
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        message_hints_[result].RequestHintOnFieldNumbers(
            proto.reserved_range(j), DescriptorPool::ErrorCollector::NUMBER);
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Field \"$0\" uses reserved number $1.", field->name(),
                       field->number());
                 });
      }
    }
    if (reserved_name_set.contains(field->name())) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Field name \"$0\" is reserved.",
                                         field->name());
               });
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers or names.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end_number() > range2->start &&
          range2->end > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "reserved range $2 to $3.",
                       range1->start_number(), range1->end_number() - 1,
                       range2->start, range2->end - 1);
                 });
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end_number() > range2->start_number() &&
          range2->end_number() > range1->start_number()) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Extension range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2->start_number(), range2->end_number() - 1,
                       range1->start_number(), range1->end_number() - 1);
                 });
      }
    }
  }
}